

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O2

void Abc_FlowRetime_UpdateForwardInit(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pObj;
  Abc_Obj_t *pLatch;
  int i;
  
  if (pManMR->fVerbose != 0) {
    puts("\t\tupdating init state");
  }
  Abc_NtkIncrementTravId(pNtk);
  for (i = 0; i < pNtk->vBoxes->nSize; i = i + 1) {
    pLatch = Abc_NtkBox(pNtk,i);
    if ((*(uint *)&pLatch->field_0x14 & 0xf) == 8) {
      pObj = (Abc_Obj_t *)pLatch->pNtk->vObjs->pArray[*(pLatch->vFanins).pArray];
      Abc_FlowRetime_UpdateForwardInit_rec(pObj);
      if ((undefined1  [24])
          ((undefined1  [24])pManMR->pDataArray[(uint)pObj->Id] & (undefined1  [24])0x20) ==
          (undefined1  [24])0x0) {
        if ((undefined1  [24])
            ((undefined1  [24])pManMR->pDataArray[(uint)pObj->Id] & (undefined1  [24])0x40) ==
            (undefined1  [24])0x0) {
          Abc_LatchSetInitDc(pLatch);
        }
        else {
          Abc_LatchSetInit1(pLatch);
        }
      }
      else {
        Abc_LatchSetInit0(pLatch);
      }
    }
  }
  return;
}

Assistant:

void Abc_FlowRetime_UpdateForwardInit( Abc_Ntk_t * pNtk ) {
  Abc_Obj_t *pObj, *pFanin;
  int i;

  vprintf("\t\tupdating init state\n");

  Abc_NtkIncrementTravId( pNtk );

  Abc_NtkForEachLatch( pNtk, pObj, i ) {
    pFanin = Abc_ObjFanin0(pObj);
    Abc_FlowRetime_UpdateForwardInit_rec( pFanin );

    if (FTEST(pFanin, INIT_0))
      Abc_LatchSetInit0( pObj );
    else if (FTEST(pFanin, INIT_1))
      Abc_LatchSetInit1( pObj );
    else
      Abc_LatchSetInitDc( pObj );
  }
}